

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore_desktop_glfw.c
# Opt level: O1

void SetWindowMaxSize(int width,int height)

{
  CORE.Window.screenMax.width = width;
  CORE.Window.screenMax.height = height;
  glfwSetWindowSizeLimits
            (platform.handle,-(uint)(CORE.Window.screenMin.width == 0) | CORE.Window.screenMin.width
             ,-(uint)(CORE.Window.screenMin.height == 0) | CORE.Window.screenMin.height,
             -(uint)(width == 0) | width,-(uint)(height == 0) | height);
  return;
}

Assistant:

void SetWindowMaxSize(int width, int height)
{
    CORE.Window.screenMax.width = width;
    CORE.Window.screenMax.height = height;

    int minWidth  = (CORE.Window.screenMin.width  == 0)? GLFW_DONT_CARE : (int)CORE.Window.screenMin.width;
    int minHeight = (CORE.Window.screenMin.height == 0)? GLFW_DONT_CARE : (int)CORE.Window.screenMin.height;
    int maxWidth  = (CORE.Window.screenMax.width  == 0)? GLFW_DONT_CARE : (int)CORE.Window.screenMax.width;
    int maxHeight = (CORE.Window.screenMax.height == 0)? GLFW_DONT_CARE : (int)CORE.Window.screenMax.height;

    glfwSetWindowSizeLimits(platform.handle, minWidth, minHeight, maxWidth, maxHeight);
}